

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall
GdlGlyphDefn::CheckExistenceOfGlyphAttr
          (GdlGlyphDefn *this,GdlObject *pgdlAvsOrExp,GrcSymbolTable *param_2,
          GrcGlyphAttrMatrix *pgax,Symbol psymGlyphAttr)

{
  ushort wGlyphID;
  pointer puVar1;
  string sta4;
  char cVar2;
  bool bVar3;
  gid16 wGlyphID_00;
  ulong uVar4;
  unkbyte9 in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff0a;
  int nAttrID;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  nAttrID = psymGlyphAttr->m_nInternalID;
  std::__cxx11::string::string((string *)&local_50,"gpoint",(allocator *)&stack0xffffffffffffff0a);
  cVar2 = std::operator==(&psymGlyphAttr->m_staFieldName,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  for (uVar4 = 0;
      puVar1 = (this->m_vwGlyphIDs).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->m_vwGlyphIDs).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1);
      uVar4 = uVar4 + 1) {
    wGlyphID = puVar1[uVar4];
    if (wGlyphID != 0xfffb) {
      if (cVar2 == '\0') {
        bVar3 = GrcGlyphAttrMatrix::Defined(pgax,wGlyphID,nAttrID,0);
      }
      else {
        bVar3 = GrcGlyphAttrMatrix::GpointDefined(pgax,wGlyphID,nAttrID,0);
      }
      if (bVar3 == false) {
        std::__cxx11::string::string
                  ((string *)&local_70,"Glyph attribute \'",(allocator *)&stack0xffffffffffffff0a);
        GrcSymbolTableEntry::FullName_abi_cxx11_(&local_d0,psymGlyphAttr);
        std::__cxx11::string::string
                  ((string *)&local_90,"\' is not defined for glyph ",
                   (allocator *)&stack0xffffffffffffff0b);
        GlyphIDString_abi_cxx11_(&local_b0,(GdlGlyphDefn *)(ulong)wGlyphID,wGlyphID_00);
        sta4._8_9_ = in_stack_ffffffffffffff00;
        sta4._M_dataplus._M_p = (pointer)&local_b0;
        sta4.field_2._M_local_buf[1] = cVar2;
        sta4.field_2._M_allocated_capacity._2_2_ = in_stack_ffffffffffffff0a;
        sta4.field_2._M_allocated_capacity._4_4_ = nAttrID;
        sta4.field_2._8_8_ = pgax;
        GrcErrorList::AddError(&g_errorList,0x102a,pgdlAvsOrExp,&local_70,&local_d0,&local_90,sta4);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  return;
}

Assistant:

void GdlGlyphDefn::CheckExistenceOfGlyphAttr(GdlObject * pgdlAvsOrExp,
	GrcSymbolTable * /*psymtbl*/, GrcGlyphAttrMatrix * pgax, Symbol psymGlyphAttr)
{
	int nGlyphAttrID = psymGlyphAttr->InternalID();
	bool fGpoint = psymGlyphAttr->LastFieldIs("gpoint");

	for (size_t iw = 0; iw < m_vwGlyphIDs.size(); iw++)
	{
		if (m_vwGlyphIDs[iw] == kBadGlyph)
			continue;

		gid16 wGlyphID = m_vwGlyphIDs[iw];
		if ((fGpoint && !pgax->GpointDefined(wGlyphID, nGlyphAttrID)) ||
			(!fGpoint && !pgax->Defined(wGlyphID, nGlyphAttrID)))
		{
			g_errorList.AddError(4138, pgdlAvsOrExp,
				"Glyph attribute '",
				psymGlyphAttr->FullName(),
				"' is not defined for glyph ",
				GlyphIDString(wGlyphID));
		}
	}
}